

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_short,unsigned_short(*&)(unsigned_short,unsigned_short)>
          (Memory *this,u64 offset,u64 addend,unsigned_short rhs,
          BinopFunc<unsigned_short,_unsigned_short> **func,unsigned_short *out)

{
  u64 addend_00;
  u64 offset_00;
  bool bVar1;
  unsigned_short val;
  Result RVar2;
  unsigned_short local_42;
  unsigned_short *puStack_40;
  unsigned_short lhs;
  unsigned_short *out_local;
  BinopFunc<unsigned_short,_unsigned_short> **func_local;
  u64 uStack_28;
  unsigned_short rhs_local;
  u64 addend_local;
  u64 offset_local;
  Memory *this_local;
  
  puStack_40 = out;
  out_local = (unsigned_short *)func;
  func_local._6_2_ = rhs;
  uStack_28 = addend;
  addend_local = offset;
  offset_local = (u64)this;
  RVar2 = AtomicLoad<unsigned_short>(this,offset,addend,&local_42);
  bVar1 = Failed(RVar2);
  offset_00 = addend_local;
  addend_00 = uStack_28;
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    val = (**(code **)out_local)(local_42,func_local._6_2_);
    RVar2 = AtomicStore<unsigned_short>(this,offset_00,addend_00,val);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      *puStack_40 = local_42;
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Memory::AtomicRmw(u64 offset, u64 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}